

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

void * max_new(t_symbol *s,int argc,t_atom *argv)

{
  t_float tVar1;
  t_max *x_1;
  t_scalarmax *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  if (1 < argc) {
    post("max~: extra arguments ignored");
  }
  if (argc == 0) {
    s_local = (t_symbol *)pd_new(max_class);
    inlet_new((t_object *)s_local,(t_pd *)s_local,&s_signal,&s_signal);
    outlet_new((t_object *)s_local,&s_signal);
    *(undefined4 *)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd = 0;
  }
  else {
    s_local = (t_symbol *)pd_new(scalarmax_class);
    floatinlet_new((t_object *)s_local,
                   (t_float *)((long)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd + 4));
    tVar1 = atom_getfloatarg(0,argc,argv);
    *(t_float *)((long)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd + 4) = tVar1;
    outlet_new((t_object *)s_local,&s_signal);
    *(undefined4 *)&(((t_object *)((long)s_local + 0x30))->te_g).g_pd = 0;
  }
  return s_local;
}

Assistant:

static void *max_new(t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1) post("max~: extra arguments ignored");
    if (argc)
    {
        t_scalarmax *x = (t_scalarmax *)pd_new(scalarmax_class);
        floatinlet_new(&x->x_obj, &x->x_g);
        x->x_g = atom_getfloatarg(0, argc, argv);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
    else
    {
        t_max *x = (t_max *)pd_new(max_class);
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
}